

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O1

uintptr_t ngx_escape_html(u_char *dst,u_char *src,size_t size)

{
  byte bVar1;
  size_t sVar2;
  
  if (dst == (u_char *)0x0) {
    if (size == 0) {
      return 0;
    }
    sVar2 = 0;
    dst = (u_char *)0x0;
    do {
      bVar1 = src[sVar2];
      if (bVar1 < 0x3c) {
        if (bVar1 == 0x22) {
          dst = dst + 5;
        }
        else if (bVar1 == 0x26) {
          dst = dst + 4;
        }
      }
      else if ((bVar1 == 0x3e) || (bVar1 == 0x3c)) {
        dst = dst + 3;
      }
      sVar2 = sVar2 + 1;
    } while (size != sVar2);
  }
  else if (size != 0) {
    sVar2 = 0;
    do {
      bVar1 = src[sVar2];
      if (bVar1 < 0x3c) {
        if (bVar1 == 0x22) {
          dst[0] = 0x26;
          dst[1] = 0x71;
          dst[2] = 0x75;
          dst[3] = 0x6f;
          dst[4] = 0x74;
          dst[5] = 0x3b;
          dst = dst + 6;
        }
        else if (bVar1 == 0x26) {
          dst[0] = 0x26;
          dst[1] = 0x61;
          dst[2] = 0x6d;
          dst[3] = 0x70;
          dst[4] = 0x3b;
          dst = dst + 5;
        }
        else {
LAB_001181d4:
          *dst = bVar1;
          dst = dst + 1;
        }
      }
      else {
        if (bVar1 == 0x3e) {
          dst[0] = 0x26;
          dst[1] = 0x67;
          dst[2] = 0x74;
          dst[3] = 0x3b;
        }
        else {
          if (bVar1 != 0x3c) goto LAB_001181d4;
          dst[0] = 0x26;
          dst[1] = 0x6c;
          dst[2] = 0x74;
          dst[3] = 0x3b;
        }
        dst = dst + 4;
      }
      sVar2 = sVar2 + 1;
      if (size == sVar2) {
        return (uintptr_t)dst;
      }
    } while( true );
  }
  return (uintptr_t)dst;
}

Assistant:

uintptr_t
ngx_escape_html(u_char *dst, u_char *src, size_t size)
{
    u_char      ch;
    ngx_uint_t  len;

    if (dst == NULL) {

        len = 0;

        while (size) {
            switch (*src++) {

            case '<':
                len += sizeof("&lt;") - 2;
                break;

            case '>':
                len += sizeof("&gt;") - 2;
                break;

            case '&':
                len += sizeof("&amp;") - 2;
                break;

            case '"':
                len += sizeof("&quot;") - 2;
                break;

            default:
                break;
            }
            size--;
        }

        return (uintptr_t) len;
    }

    while (size) {
        ch = *src++;

        switch (ch) {

        case '<':
            *dst++ = '&'; *dst++ = 'l'; *dst++ = 't'; *dst++ = ';';
            break;

        case '>':
            *dst++ = '&'; *dst++ = 'g'; *dst++ = 't'; *dst++ = ';';
            break;

        case '&':
            *dst++ = '&'; *dst++ = 'a'; *dst++ = 'm'; *dst++ = 'p';
            *dst++ = ';';
            break;

        case '"':
            *dst++ = '&'; *dst++ = 'q'; *dst++ = 'u'; *dst++ = 'o';
            *dst++ = 't'; *dst++ = ';';
            break;

        default:
            *dst++ = ch;
            break;
        }
        size--;
    }

    return (uintptr_t) dst;
}